

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::first_non_empty_span(basic_substring<const_char> *this)

{
  ro_substr chars;
  ro_substr chars_00;
  basic_substring<const_char> bVar1;
  bool bVar2;
  size_t in_RDI;
  basic_substring<const_char> ret;
  size_t pos;
  ro_substr empty_chars;
  undefined4 in_stack_fffffffffffffec0;
  error_flags in_stack_fffffffffffffec4;
  char *in_stack_fffffffffffffec8;
  char *s_;
  undefined2 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed2;
  undefined1 uVar3;
  undefined1 in_stack_fffffffffffffed3;
  error_flags in_stack_fffffffffffffed4;
  size_t in_stack_fffffffffffffee0;
  basic_substring<const_char> *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  basic_substring<const_char> *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined8 local_e0;
  ulong local_d8;
  char *local_d0;
  undefined8 local_c8;
  size_t local_c0;
  char *local_b8;
  undefined8 local_b0;
  char *local_a0;
  size_t local_98;
  char *local_90;
  undefined4 local_88;
  size_t local_80;
  undefined8 local_70;
  ulong local_68;
  char *local_60;
  undefined4 local_58;
  size_t local_50;
  char *local_48;
  char *local_40;
  size_t local_38;
  undefined8 local_20;
  char *local_10;
  size_t local_8;
  
  local_b8 = " \n\r\t";
  local_b0 = 4;
  local_d0 = " \n\r\t";
  local_c8 = 4;
  chars.str._4_4_ = in_stack_fffffffffffffef4;
  chars.str._0_4_ = in_stack_fffffffffffffef0;
  chars.len = (size_t)in_stack_fffffffffffffef8;
  local_c0 = first_not_of(in_stack_fffffffffffffee8,chars,in_stack_fffffffffffffee0);
  if (local_c0 == 0xffffffffffffffff) {
    local_20 = 0;
    basic_substring((basic_substring<const_char> *)
                    CONCAT44(in_stack_fffffffffffffed4,
                             CONCAT13(in_stack_fffffffffffffed3,
                                      CONCAT12(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0))
                            ),in_stack_fffffffffffffec8,
                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    local_a0 = local_10;
    local_98 = local_8;
  }
  else {
    local_80 = local_c0;
    if (*(ulong *)(in_RDI + 8) < local_c0) {
      in_stack_fffffffffffffed4 = get_error_flags();
      if (((in_stack_fffffffffffffed4 & 1) != 0) &&
         (in_stack_fffffffffffffed3 = is_debugger_attached(), (bool)in_stack_fffffffffffffed3)) {
        trap_instruction();
      }
      local_90 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_88 = 0x1533;
      handle_error(0x3fa1ef,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring((basic_substring<const_char> *)
                    CONCAT44(in_stack_fffffffffffffed4,
                             CONCAT13(in_stack_fffffffffffffed3,
                                      CONCAT12(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0))
                            ),in_stack_fffffffffffffec8,
                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    local_e0 = local_70;
    local_d8 = local_68;
    chars_00.str._7_1_ = in_stack_ffffffffffffff07;
    chars_00.str._0_7_ = in_stack_ffffffffffffff00;
    chars_00.len = in_RDI;
    local_c0 = first_of(in_stack_fffffffffffffef8,chars_00,
                        CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    s_ = (char *)&local_e0;
    uVar3 = local_c0 <= local_d8 || local_c0 == 0xffffffffffffffff;
    local_50 = local_c0;
    local_48 = s_;
    if (local_c0 > local_d8 && local_c0 != 0xffffffffffffffff) {
      in_stack_fffffffffffffec4 = get_error_flags();
      if ((in_stack_fffffffffffffec4 & 1) != 0) {
        bVar2 = is_debugger_attached();
        in_stack_fffffffffffffec0 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffec0);
        if (bVar2) {
          trap_instruction();
        }
      }
      local_60 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_58 = 0x154e;
      handle_error(0x3fa1ef,(char *)0x154e,"check failed: %s","num <= len || num == npos");
    }
    basic_substring((basic_substring<const_char> *)
                    CONCAT44(in_stack_fffffffffffffed4,
                             CONCAT13(in_stack_fffffffffffffed3,
                                      CONCAT12(uVar3,in_stack_fffffffffffffed0))),s_,
                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    local_a0 = local_40;
    local_98 = local_38;
  }
  bVar1.len = local_98;
  bVar1.str = local_a0;
  return bVar1;
}

Assistant:

basic_substring first_non_empty_span() const
    {
        constexpr const ro_substr empty_chars(" \n\r\t");
        size_t pos = first_not_of(empty_chars);
        if(pos == npos)
            return first(0);
        auto ret = sub(pos);
        pos = ret.first_of(empty_chars);
        return ret.first(pos);
    }